

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void accept_bribe(tgestate_t *state)

{
  vischar_t *vischar;
  item_t *piVar1;
  uint8_t *puVar2;
  byte bVar3;
  char cVar4;
  
  bVar3 = 0x66;
  if (state->morale < 0x66) {
    bVar3 = state->morale;
  }
  state->morale = bVar3 + 10;
  increase_score(state,'2');
  vischar = state->IY;
  vischar->flags = '\0';
  get_target_assign_pos(state,vischar,&vischar->route);
  if (state->items_held[0] == '\x05') {
    piVar1 = state->items_held;
  }
  else {
    if (state->items_held[1] != '\x05') {
      return;
    }
    piVar1 = state->items_held + 1;
  }
  *piVar1 = 0xff;
  state->item_structs[5].room_and_flags = '?';
  draw_item(state,state->items_held[0],0x1087);
  draw_item(state,state->items_held[1],0x108a);
  puVar2 = &state->vischars[1].flags;
  cVar4 = -7;
  do {
    if (((vischar_t *)(puVar2 + -1))->character < 0x14) {
      *puVar2 = '\x04';
    }
    puVar2 = puVar2 + 0x40;
    cVar4 = cVar4 + '\x01';
  } while (cVar4 != '\0');
  queue_message(state,message_HE_TAKES_THE_BRIBE);
  queue_message(state,message_AND_ACTS_AS_DECOY);
  return;
}

Assistant:

void accept_bribe(tgestate_t *state)
{
  route_t    *route;  /* was HL */
  item_t    *item;    /* was DE */
  uint8_t    iters;   /* was B */
  vischar_t *vischar; /* was HL */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(state->IY);

  increase_morale_by_10_score_by_50(state);

  /* Clear the vischar_PURSUIT_PURSUE flag. */
  state->IY->flags = 0;

  route = &state->IY->route;
  get_target_assign_pos(state, state->IY, route);

  /* Return early if we have no bribes. */
  item = &state->items_held[0];
  if (*item != item_BRIBE && *++item != item_BRIBE)
    return;

  /* Remove the bribe item. */
  *item = item_NONE;
  state->item_structs[item_BRIBE].room_and_flags = (room_t) itemstruct_ROOM_NONE;
  draw_all_items(state);

  /* Set the vischar_PURSUIT_SAW_BRIBE flag on all visible hostiles. */
  iters   = vischars_LENGTH - 1;
  vischar = &state->vischars[1];
  do
  {
    if (vischar->character <= character_19_GUARD_DOG_4)
      vischar->flags = vischar_PURSUIT_SAW_BRIBE;
    vischar++;
  }
  while (--iters);

  queue_message(state, message_HE_TAKES_THE_BRIBE);
  queue_message(state, message_AND_ACTS_AS_DECOY);
}